

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O1

ParseTokenKind __thiscall
TTD::TextFormatReader::ScanWellKnownToken
          (TextFormatReader *this,
          List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *charList)

{
  int iVar1;
  bool bVar2;
  char16 local_2a [4];
  char16 c;
  
  local_2a[0] = L'\0';
  bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
  if (bVar2) {
    do {
      if (local_2a[0] == L'\0') {
        return (uint)(ushort)local_2a[0];
      }
      if (local_2a[0] == L'~') {
        return WellKnownToken;
      }
      JsUtil::List<char16_t,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
      EnsureArray(charList,0);
      iVar1 = (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count
      ;
      (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).buffer[iVar1]
           = local_2a[0];
      (charList->super_ReadOnlyList<char16_t,_Memory::HeapAllocator,_DefaultComparer>).count =
           iVar1 + 1;
      bVar2 = FileReader::ReadRawChar(&this->super_FileReader,local_2a);
    } while (bVar2);
  }
  return Error;
}

Assistant:

NSTokens::ParseTokenKind TextFormatReader::ScanWellKnownToken(JsUtil::List<char16, HeapAllocator>& charList)
    {
        char16 c = _u('\0');
        bool endFound = false;

        while(this->ReadRawChar(&c))
        {
            if(c == 0)
            {
                return NSTokens::ParseTokenKind::Error;
            }

            if(c == _u('~'))
            {
                //end of the string
                endFound = true;
                break;
            }
            else
            {
                charList.Add(c);
            }
        }

        if(!endFound)
        {
            // no ending found
            return NSTokens::ParseTokenKind::Error;
        }

        return NSTokens::ParseTokenKind::WellKnownToken;
    }